

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void testDifferentPacketConfigWorks(void)

{
  pointer *ppuVar1;
  uint uVar2;
  __type _Var3;
  Status SVar4;
  int iVar5;
  ostream *poVar6;
  ulong uVar7;
  size_t sVar8;
  char *__function;
  ulong len;
  ulong uVar9;
  Status state;
  pointer puVar10;
  allocator local_24d;
  int local_24c;
  string serialized;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  PacketT<TestConfig> p;
  PacketT<TestConfig> p_1;
  
  std::__cxx11::string::string((string *)&local_228,"content",&local_24d);
  packet::PacketT<TestConfig>::PacketT(&p_1);
  std::__cxx11::stringstream::stringstream((stringstream *)&p);
  if ((local_228._M_dataplus._M_p == (pointer)0x0) || (9 < (int)local_228._M_string_length - 1U)) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"[");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/agudpp[P]packet/src/test_helpers.hpp"
                            );
    poVar6 = std::operator<<(poVar6,", ");
    poVar6 = std::operator<<(poVar6,"serializePacketFromData");
    poVar6 = std::operator<<(poVar6,", ");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0x56);
    std::operator<<(poVar6,
                    "] TEST_ASSERT failed p.serialize(reinterpret_cast<const packet::byte_t*>(data.data()), data.size(), ss)\n"
                   );
    __function = 
    "std::string serializePacketFromData(const std::string &) [PacketType = packet::PacketT<TestConfig>]"
    ;
    uVar2 = 0x56;
  }
  else {
    ppuVar1 = &p.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    std::ostream::write((char *)ppuVar1,0x106410);
    local_24c = (int)local_228._M_string_length << 0x18;
    std::ostream::write((char *)ppuVar1,(long)&local_24c);
    std::ostream::write((char *)ppuVar1,(long)local_228._M_dataplus._M_p);
    std::ostream::write((char *)ppuVar1,0x106491);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&p);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&p_1.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    poVar6 = std::operator<<((ostream *)&std::cout,"Serialized data: ");
    poVar6 = std::operator<<(poVar6,(string *)&serialized);
    std::operator<<(poVar6,"\n");
    packet::PacketT<TestConfig>::PacketT(&p);
    uVar9 = 0;
    while( true ) {
      if ((p.status_ != INCOMPLETE) ||
         (uVar7 = serialized._M_string_length - uVar9,
         serialized._M_string_length < uVar9 || uVar7 == 0)) {
        poVar6 = std::operator<<((ostream *)&std::cout,"packet status: ");
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,p.status_);
        std::operator<<(poVar6,"\n");
        if (p.status_ == COMPLETE) {
          puVar10 = p.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start + 5;
          if ((ulong)p.pkt_data_len_ == 0) {
            puVar10 = (pointer)0x0;
          }
          p_1._0_8_ = &p_1.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&p_1,puVar10,puVar10 + p.pkt_data_len_);
          _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&p_1,&local_228);
          std::__cxx11::string::~string((string *)&p_1);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&p.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
          std::__cxx11::string::~string((string *)&serialized);
          std::__cxx11::string::~string((string *)&local_228);
          if (_Var3) {
            return;
          }
        }
        else {
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&p.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
          std::__cxx11::string::~string((string *)&serialized);
          std::__cxx11::string::~string((string *)&local_228);
        }
        poVar6 = std::operator<<((ostream *)&std::cerr,"[");
        poVar6 = std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/agudpp[P]packet/src/test.cpp"
                                );
        poVar6 = std::operator<<(poVar6,", ");
        poVar6 = std::operator<<(poVar6,"testDifferentPacketConfigWorks");
        poVar6 = std::operator<<(poVar6,", ");
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0x39);
        std::operator<<(poVar6,
                        "] TEST_ASSERT failed checkSerializeAndUnserialize<Packet>(\"content\")\n");
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/agudpp[P]packet/src/test.cpp"
                      ,0x39,"void testDifferentPacketConfigWorks()");
      }
      len = (p.buffer_part_.size_ + p.buffer_part_.start_idx_) - p.buffer_part_.data_idx_;
      if (len == 0) break;
      if (uVar7 < len) {
        len = uVar7;
      }
      sVar8 = packet::BufferPart::append
                        (&p.buffer_part_,(byte_t *)(serialized._M_dataplus._M_p + uVar9),len);
      if ((p.reading_state_ == NONE) ||
         (p.buffer_part_.data_idx_ < p.buffer_part_.size_ + p.buffer_part_.start_idx_))
      goto LAB_001038ab;
      p.current_data_idx_ =
           p.current_data_idx_ + (p.buffer_part_.data_idx_ - p.buffer_part_.start_idx_);
      SVar4 = INVALID;
      state = COMPLETE|INVALID;
      switch(p.reading_state_) {
      case HEAD_PATTERN:
        iVar5 = bcmp("<",((p.buffer_part_.real_buffer_)->
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                         super__Vector_impl_data._M_start + p.buffer_part_.start_idx_,
                     (ulong)(p.buffer_part_.data_idx_ != p.buffer_part_.start_idx_));
        state = SVar4;
        goto LAB_00103898;
      case DATA_SIZE:
        uVar2 = *(uint *)(((p.buffer_part_.real_buffer_)->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_start + p.buffer_part_.start_idx_);
        state = COMPLETE;
        if ((uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) < 0xb)
        goto switchD_00103825_caseD_2;
      default:
switchD_00103825_default:
        p.reading_state_ = NONE;
LAB_001038a7:
        p.status_ = SVar4;
        break;
      case DATA:
        goto switchD_00103825_caseD_2;
      case TAIL_PATTERN:
        iVar5 = bcmp(">",((p.buffer_part_.real_buffer_)->
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                         super__Vector_impl_data._M_start + p.buffer_part_.start_idx_,
                     (ulong)(p.buffer_part_.data_idx_ != p.buffer_part_.start_idx_));
        state = 4;
LAB_00103898:
        if (iVar5 != 0) goto switchD_00103825_default;
switchD_00103825_caseD_2:
        packet::PacketT<TestConfig>::setupState(&p,state);
        SVar4 = COMPLETE;
        if (p.reading_state_ == NONE) goto LAB_001038a7;
      }
LAB_001038ab:
      uVar9 = uVar9 + sVar8;
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"[");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/agudpp[P]packet/src/test_helpers.hpp"
                            );
    poVar6 = std::operator<<(poVar6,", ");
    poVar6 = std::operator<<(poVar6,"readPacketPart");
    poVar6 = std::operator<<(poVar6,", ");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0x35);
    std::operator<<(poVar6,"] TEST_ASSERT failed pkt.remainingBytes() > 0\n");
    __function = 
    "void readPacketPart(const std::string &, PacketType &) [PacketType = packet::PacketT<TestConfig>]"
    ;
    uVar2 = 0x35;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/agudpp[P]packet/src/test_helpers.hpp"
                ,uVar2,__function);
}

Assistant:

void
testDifferentPacketConfigWorks()
{
    // serialize a pakcet with different configuration should work
    struct TestConfig : packet::ConfigT<
            packet::DefaultStartPattern,
            packet::DefaultEndPattern,
            std::uint32_t,
            10
            >{};
    using Packet = packet::PacketT<TestConfig>;

    TEST_ASSERT(checkSerializeAndUnserialize<Packet>("content"));
}